

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O1

TsdlAttr * __thiscall
yactfr::internal::TsdlParser::_expectAttr(TsdlAttr *__return_storage_ptr__,TsdlParser *this)

{
  char *pcVar1;
  string msg;
  string msg_00;
  string msg_01;
  TextLocation loc;
  TextLocation loc_00;
  TextLocation loc_01;
  bool bVar2;
  int iVar3;
  string *psVar4;
  string *psVar5;
  Kind KVar6;
  optional<unsigned_long_long> oVar7;
  optional<long_long> oVar8;
  undefined8 in_stack_ffffffffffffff40;
  Index in_stack_ffffffffffffff48;
  undefined1 *puVar9;
  undefined1 in_stack_ffffffffffffff50 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  TextLocation local_58;
  TextLocation local_40;
  
  __return_storage_ptr__->kind = Unset;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->strVal)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strVal).field_2;
  (__return_storage_ptr__->strVal)._M_string_length = 0;
  (__return_storage_ptr__->strVal).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->valLoc).super_type.m_initialized = false;
  __return_storage_ptr__->hasEquivBool = false;
  __return_storage_ptr__->equivBool = false;
  __return_storage_ptr__->uintVal = 0;
  __return_storage_ptr__->intVal = 0;
  (__return_storage_ptr__->nameLoc).super_type.m_initialized = false;
  StrScanner::skipCommentsAndWhitespaces<true,true>(&this->_ss);
  pcVar1 = (this->_ss)._at;
  TextLocation::TextLocation
            (&local_58,(long)pcVar1 - (long)(this->_ss)._begin,(this->_ss)._nbLines,
             (long)pcVar1 - (long)(this->_ss)._lineBegin);
  (__return_storage_ptr__->nameLoc).super_type.m_storage.dummy_.aligner_ = (type)local_58._offset;
  *(Index *)((long)&(__return_storage_ptr__->nameLoc).super_type.m_storage.dummy_ + 8) =
       local_58._lineNumber;
  *(Index *)((long)&(__return_storage_ptr__->nameLoc).super_type.m_storage.dummy_ + 0x10) =
       local_58._colNumber;
  if ((__return_storage_ptr__->nameLoc).super_type.m_initialized == false) {
    (__return_storage_ptr__->nameLoc).super_type.m_initialized = true;
  }
  bVar2 = StrScanner::tryScanToken<true,true>(&this->_ss,"model.emf.uri");
  psVar5 = &__return_storage_ptr__->name;
  if (bVar2) {
    std::__cxx11::string::_M_replace
              ((ulong)psVar5,0,(char *)(__return_storage_ptr__->name)._M_string_length,0x2a9407);
  }
  else {
    psVar4 = StrScanner::tryScanIdent<true,true>(&this->_ss);
    if (psVar4 == (string *)0x0) {
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"Expecting attribute name.","");
      if ((__return_storage_ptr__->nameLoc).super_type.m_initialized != false) {
        msg.field_2._8_8_ = in_stack_ffffffffffffff40;
        msg._0_24_ = (__return_storage_ptr__->nameLoc).super_type.m_storage.dummy_;
        loc._lineNumber = in_stack_ffffffffffffff50._0_8_;
        loc._colNumber = in_stack_ffffffffffffff50._8_8_;
        loc._offset = in_stack_ffffffffffffff48;
        throwTextParseError(msg,loc);
      }
      goto LAB_00251bfb;
    }
    std::__cxx11::string::_M_assign((string *)psVar5);
  }
  _expectToken(this,"=");
  StrScanner::skipCommentsAndWhitespaces<true,true>(&this->_ss);
  pcVar1 = (this->_ss)._at;
  TextLocation::TextLocation
            (&local_58,(long)pcVar1 - (long)(this->_ss)._begin,(this->_ss)._nbLines,
             (long)pcVar1 - (long)(this->_ss)._lineBegin);
  (__return_storage_ptr__->valLoc).super_type.m_storage.dummy_.aligner_ = (type)local_58._offset;
  *(Index *)((long)&(__return_storage_ptr__->valLoc).super_type.m_storage.dummy_ + 8) =
       local_58._lineNumber;
  *(Index *)((long)&(__return_storage_ptr__->valLoc).super_type.m_storage.dummy_ + 0x10) =
       local_58._colNumber;
  if ((__return_storage_ptr__->valLoc).super_type.m_initialized == false) {
    (__return_storage_ptr__->valLoc).super_type.m_initialized = true;
  }
  psVar4 = &__return_storage_ptr__->strVal;
  iVar3 = std::__cxx11::string::compare((char *)psVar5);
  if (iVar3 == 0) {
    __return_storage_ptr__->kind = ClkNameValue;
    _expectToken(this,"clock");
    _expectToken(this,".");
    psVar5 = StrScanner::tryScanIdent<true,true>(&this->_ss);
    if (psVar5 == (string *)0x0) {
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Expecting identifier (clock type internal ID).","");
      pcVar1 = (this->_ss)._at;
      TextLocation::TextLocation
                (&local_40,(long)pcVar1 - (long)(this->_ss)._begin,(this->_ss)._nbLines,
                 (long)pcVar1 - (long)(this->_ss)._lineBegin);
      msg_00._M_string_length = local_40._lineNumber;
      msg_00._M_dataplus._M_p = (pointer)local_40._offset;
      msg_00.field_2._M_allocated_capacity = local_40._colNumber;
      msg_00.field_2._8_8_ = in_stack_ffffffffffffff40;
      loc_00._lineNumber = in_stack_ffffffffffffff50._0_8_;
      loc_00._colNumber = in_stack_ffffffffffffff50._8_8_;
      loc_00._offset = in_stack_ffffffffffffff48;
      throwTextParseError(msg_00,loc_00);
    }
    std::__cxx11::string::_M_assign((string *)psVar4);
    _expectToken(this,".");
    _expectToken(this,"value");
  }
  else {
    psVar5 = _tryScanLitStr_abi_cxx11_(this);
    if (psVar5 == (string *)0x0) {
      psVar5 = StrScanner::tryScanIdent<true,true>(&this->_ss);
      if (psVar5 == (string *)0x0) {
        oVar7 = StrScanner::tryScanConstInt<true,true,unsigned_long_long,true>(&this->_ss);
        if (((undefined1  [16])oVar7.super_type & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          oVar8 = StrScanner::tryScanConstInt<true,true,long_long,true>(&this->_ss);
          if (((undefined1  [16])oVar8.super_type & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          {
            puVar9 = &stack0xffffffffffffff58;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xffffffffffffff48,
                       "Expecting valid constant integer, literal string, or identifier.","");
            if ((__return_storage_ptr__->valLoc).super_type.m_initialized != false) {
              msg_01.field_2._8_8_ = in_stack_ffffffffffffff40;
              msg_01._0_24_ = (__return_storage_ptr__->valLoc).super_type.m_storage.dummy_;
              loc_01._lineNumber = in_stack_ffffffffffffff50._0_8_;
              loc_01._colNumber = in_stack_ffffffffffffff50._8_8_;
              loc_01._offset = (Index)puVar9;
              throwTextParseError(msg_01,loc_01);
            }
LAB_00251bfb:
            __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                          "reference_type boost::optional<yactfr::TextLocation>::get() [T = yactfr::TextLocation]"
                         );
          }
          __return_storage_ptr__->intVal = oVar8.super_type.m_storage;
          __return_storage_ptr__->kind = SInt;
          if ((ulong)oVar8.super_type.m_storage < 2) {
            __assert_fail("attr.intVal != 0 && attr.intVal != 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/tsdl-parser.cpp"
                          ,0xa69,"TsdlAttr yactfr::internal::TsdlParser::_expectAttr()");
          }
          goto LAB_00251aae;
        }
        __return_storage_ptr__->uintVal = oVar7.super_type.m_storage;
        KVar6 = UInt;
      }
      else {
        KVar6 = Ident;
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
    }
    else {
      KVar6 = Str;
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
    __return_storage_ptr__->kind = KVar6;
  }
LAB_00251aae:
  _expectToken(this,";");
  return __return_storage_ptr__;
}

Assistant:

TsdlAttr TsdlParser::_expectAttr()
{
    TsdlAttr attr;

    // parse name
    {
        auto nameIsFound = false;

        _ss.skipCommentsAndWhitespaces();
        attr.nameLoc = _ss.loc();

        if (_ss.tryScanToken("model.emf.uri")) {
            nameIsFound = true;
            attr.name = "model.emf.uri";
        } else if (const auto ident = _ss.tryScanIdent()) {
            nameIsFound = true;
            attr.name = *ident;
        }

        if (!nameIsFound) {
            throwTextParseError("Expecting attribute name.", *attr.nameLoc);
        }
    }

    // parse `=`
    this->_expectToken("=");

    // this it the source location of the attribute for an eventual error
    _ss.skipCommentsAndWhitespaces();
    attr.valLoc = _ss.loc();

    // special case for the `map` attribute
    if (attr.name == "map") {
        attr.kind = TsdlAttr::Kind::ClkNameValue;

        // parse `clock`
        this->_expectToken("clock");

        // parse `.`
        this->_expectToken(".");

        // parse internal ID (name) of clock type
        if (const auto ident = _ss.tryScanIdent()) {
            attr.strVal = *ident;
        } else {
            throwTextParseError("Expecting identifier (clock type internal ID).", _ss.loc());
        }

        // parse `.`
        this->_expectToken(".");

        // parse `value`
        this->_expectToken("value");

        // parse `;`
        this->_expectToken(";");
        return attr;
    }

    if (const auto escapedStr = this->_tryScanLitStr()) {
        // literal string
        attr.strVal = *escapedStr;
        attr.kind = TsdlAttr::Kind::Str;
    } else if (const auto ident = _ss.tryScanIdent()) {
        // identifier
        attr.strVal = *ident;
        attr.kind = TsdlAttr::Kind::Ident;
    } else if (const auto val = _ss.tryScanConstUInt()) {
        // constant unsigned integer
        attr.uintVal = *val;
        attr.kind = TsdlAttr::Kind::UInt;
    } else if (const auto val = _ss.tryScanConstSInt()) {
        // constant signed integer
        attr.intVal = *val;
        attr.kind = TsdlAttr::Kind::SInt;
        assert(attr.intVal != 0 && attr.intVal != 1);
    } else {
        throwTextParseError("Expecting valid constant integer, literal string, or identifier.",
                            *attr.valLoc);
    }

    // parse `;`
    this->_expectToken(";");
    return attr;
}